

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyBumpAllocated
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,char *bumpAllocateAddress)

{
  Recycler *this_00;
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  char *address;
  byte *corruptedAddress;
  uint local_34;
  char *pcStack_30;
  uint i;
  char *memBlock;
  Recycler *recycler;
  ushort verifyFinalizeCount;
  char *bumpAllocateAddress_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  this_00 = this->heapBucket->heapInfo->recycler;
  pcStack_30 = GetAddress(this);
  for (local_34 = 0; local_34 < this->objectCount; local_34 = local_34 + 1) {
    if (pcStack_30 < bumpAllocateAddress) {
      uVar2 = GetObjectSize(this);
      Recycler::VerifyCheckPad(this_00,pcStack_30,(ulong)uVar2);
      pbVar3 = ObjectInfo(this,local_34);
      if (((*pbVar3 & 0x80) != 0) &&
         (bVar1 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock), !bVar1)) {
        address = GetAddress(this);
        corruptedAddress = ObjectInfo(this,local_34);
        Recycler::VerifyCheck
                  (0,L"Non-Finalizable block should not have finalizable objects",address,
                   corruptedAddress);
      }
    }
    else {
      uVar2 = GetObjectSize(this);
      Recycler::VerifyCheckFill(pcStack_30 + 8,(ulong)uVar2 - 8);
    }
    uVar2 = GetObjectSize(this);
    pcStack_30 = pcStack_30 + uVar2;
  }
  return;
}

Assistant:

void SmallHeapBlockT<TBlockAttributes>::VerifyBumpAllocated(_In_ char * bumpAllocateAddress)
{
    ushort verifyFinalizeCount = 0;
    Recycler * recycler = this->heapBucket->heapInfo->recycler;
    char * memBlock = this->GetAddress();
    for (uint i = 0; i < objectCount; i++)
    {
        if (memBlock >= bumpAllocateAddress)
        {
            Recycler::VerifyCheckFill(memBlock + sizeof(FreeObject), this->GetObjectSize() - sizeof(FreeObject));
        }
        else
        {
            recycler->VerifyCheckPad(memBlock, this->GetObjectSize());
            if ((this->ObjectInfo(i) & FinalizeBit) != 0)
            {
                if (this->IsAnyFinalizableBlock())
                {
                    verifyFinalizeCount++;
                }
                else
                {
                    Recycler::VerifyCheck(false, _u("Non-Finalizable block should not have finalizable objects"),
                        this->GetAddress(), &this->ObjectInfo(i));
                }
            }
        }
        memBlock += this->GetObjectSize();
    }
}